

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

Reg ra_allocref(ASMState *as,IRRef ref,RegSet allow)

{
  byte bVar1;
  IRIns *pIVar2;
  uint uVar3;
  Reg RVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  pIVar2 = as->ir;
  uVar5 = (ulong)ref;
  uVar3 = as->freeset & allow;
  if (uVar3 == 0) {
    RVar4 = ra_evict(as,allow);
    uVar7 = (ulong)RVar4;
    goto LAB_00142b7a;
  }
  bVar1 = *(byte *)((long)pIVar2 + uVar5 * 8 + 6);
  if (bVar1 < 0xfd) {
    uVar6 = bVar1 & 0x7f;
    uVar7 = (ulong)uVar6;
    if ((uVar3 >> (bVar1 & 0x1f) & 1) != 0) goto LAB_00142b7a;
    if (((1 << ((byte)uVar6 & 0x1f) & allow) != 0) &&
       (uVar6 = (uint)(ushort)as->cost[uVar7], uVar6 < 0x8001)) {
      ra_rematk(as,uVar6);
      goto LAB_00142b7a;
    }
  }
  if ((ref < as->loopref) && ((*(byte *)((long)pIVar2 + uVar5 * 8 + 4) & 0x40) == 0)) {
    uVar6 = ~as->modset & uVar3;
    if (uVar6 == 0) {
      uVar6 = uVar3;
    }
    uVar3 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    uVar7 = (ulong)uVar3;
  }
  else {
    uVar6 = uVar3 & 0xf038;
    if ((uVar3 & 0xf038) == 0) {
      uVar6 = uVar3;
    }
    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar3 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar7 = (ulong)(uVar3 ^ 0x18);
  }
LAB_00142b7a:
  bVar1 = (byte)uVar7 & 0x1f;
  uVar3 = -2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1;
  *(byte *)((long)pIVar2 + uVar5 * 8 + 6) = (byte)uVar7;
  as->freeset = as->freeset & uVar3;
  as->weakset = as->weakset & uVar3;
  as->cost[uVar7] = (*(byte *)((long)pIVar2 + uVar5 * 8 + 4) & 0x40) * 0x10000 + ref * 0x10001;
  return (Reg)uVar7;
}

Assistant:

static Reg ra_allocref(ASMState *as, IRRef ref, RegSet allow)
{
  IRIns *ir = IR(ref);
  RegSet pick = as->freeset & allow;
  Reg r;
  lj_assertA(ra_noreg(ir->r),
	     "IR %04d already has reg %d", ref - REF_BIAS, ir->r);
  if (pick) {
    /* First check register hint from propagation or PHI. */
    if (ra_hashint(ir->r)) {
      r = ra_gethint(ir->r);
      if (rset_test(pick, r))  /* Use hint register if possible. */
	goto found;
      /* Rematerialization is cheaper than missing a hint. */
      if (rset_test(allow, r) && emit_canremat(regcost_ref(as->cost[r]))) {
	ra_rematk(as, regcost_ref(as->cost[r]));
	goto found;
      }
      RA_DBGX((as, "hintmiss  $f $r", ref, r));
    }
    /* Invariants should preferably get unmodified registers. */
    if (ref < as->loopref && !irt_isphi(ir->t)) {
      if ((pick & ~as->modset))
	pick &= ~as->modset;
      r = rset_pickbot(pick);  /* Reduce conflicts with inverse allocation. */
    } else {
      /* We've got plenty of regs, so get callee-save regs if possible. */
      if (RID_NUM_GPR > 8 && (pick & ~RSET_SCRATCH))
	pick &= ~RSET_SCRATCH;
      r = rset_picktop(pick);
    }
  } else {
    r = ra_evict(as, allow);
  }
found:
  RA_DBGX((as, "alloc     $f $r", ref, r));
  ir->r = (uint8_t)r;
  rset_clear(as->freeset, r);
  ra_noweak(as, r);
  as->cost[r] = REGCOST_REF_T(ref, irt_t(ir->t));
  return r;
}